

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O1

value hello_world_class_impl_interface_static_get(klass cls,class_impl impl,accessor_type *accessor)

{
  int iVar1;
  char *__s1;
  value pvVar2;
  
  __s1 = (char *)attribute_name((accessor->data).key);
  if (__s1 != (char *)0x0) {
    iVar1 = strcmp(__s1,"a");
    if (iVar1 == 0) {
      pvVar2 = (value)value_create_int(*impl);
      return pvVar2;
    }
    iVar1 = strcmp(__s1,"b");
    if (iVar1 == 0) {
      pvVar2 = (value)value_create_float(*(undefined4 *)((long)impl + 4));
      return pvVar2;
    }
    iVar1 = strcmp(__s1,"c");
    if (iVar1 == 0) {
      pvVar2 = (value)value_create_string((long)impl + 8,9);
      return pvVar2;
    }
  }
  return (value)0x0;
}

Assistant:

value hello_world_class_impl_interface_static_get(klass cls, class_impl impl, struct accessor_type *accessor)
{
	hello_world_class hello_world = (hello_world_class)impl;
	attribute attr = accessor->data.attr;
	char *key = attribute_name(attr);

	(void)cls;

	if (key == NULL)
	{
		return NULL;
	}

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "a") == 0)
	{
		return value_create_int(hello_world->a);
	}
	else if (strcmp(key, "b") == 0)
	{
		return value_create_float(hello_world->b);
	}
	else if (strcmp(key, "c") == 0)
	{
		return value_create_string(hello_world->c, 9);
	}

	return NULL;
}